

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O0

void __thiscall Tokens::Inverter(Tokens *this)

{
  bool bVar1;
  reference __x;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> aux;
  Tokens *this_local;
  
  aux.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_28);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)local_28,&this->Token);
  std::vector<int,_std::allocator<int>_>::clear(&this->Token);
  while( true ) {
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)local_28);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __x = std::vector<int,_std::allocator<int>_>::back
                    ((vector<int,_std::allocator<int>_> *)local_28);
    std::vector<int,_std::allocator<int>_>::push_back(&this->Token,__x);
    std::vector<int,_std::allocator<int>_>::pop_back((vector<int,_std::allocator<int>_> *)local_28);
  }
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)local_28);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

void Tokens::Inverter (){
  vector<int>aux;
  aux = Token;
  Token.clear();
  while (!aux.empty()){
    Token.push_back(aux.back());
    aux.pop_back();
  }
  aux.clear();
}